

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndividualBeliefJESP.cpp
# Opt level: O0

string * __thiscall IndividualBeliefJESP::SoftPrint_abi_cxx11_(IndividualBeliefJESP *this)

{
  uint uVar1;
  uint uVar2;
  Index IVar3;
  IndividualBeliefJESP *this_00;
  ostream *poVar4;
  ostream *poVar5;
  void *this_01;
  long *in_RSI;
  string *in_RDI;
  double dVar6;
  Index eI;
  stringstream ss;
  Index in_stack_fffffffffffffe24;
  IndividualBeliefJESP *in_stack_fffffffffffffe28;
  string local_1d0 [52];
  uint local_19c;
  stringstream local_198 [16];
  ostream local_188 [288];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff98;
  
  std::__cxx11::stringstream::stringstream(local_198);
  local_19c = 0;
  while( true ) {
    uVar1 = local_19c;
    uVar2 = (**(code **)(*in_RSI + 0x70))();
    if (uVar2 <= uVar1) break;
    this_00 = (IndividualBeliefJESP *)std::operator<<(local_188,"eI=");
    poVar4 = (ostream *)std::ostream::operator<<(this_00,local_19c);
    poVar5 = std::operator<<(poVar4,",[sI=");
    IVar3 = GetStateIndex(this_00,(Index)((ulong)poVar4 >> 0x20));
    poVar4 = (ostream *)std::ostream::operator<<(poVar5,IVar3);
    poVar4 = std::operator<<(poVar4,", ");
    GetOthersObservationHistIndex(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
    PrintTools::SoftPrintVector<unsigned_int>(in_stack_ffffffffffffff98);
    poVar4 = std::operator<<(poVar4,local_1d0);
    poVar5 = std::operator<<(poVar4," ] - p=");
    dVar6 = (double)(**(code **)(*in_RSI + 0x48))(in_RSI,local_19c);
    this_01 = (void *)std::ostream::operator<<(poVar5,dVar6);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1d0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)poVar4);
    local_19c = local_19c + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string IndividualBeliefJESP::SoftPrint() const
{
    stringstream ss;
    for(Index eI=0; eI < Size(); eI++)
    {
        ss << "eI="<<eI<<",[sI="<<GetStateIndex(eI) << ", " <<
            SoftPrintVector(GetOthersObservationHistIndex(eI)) << " ] - p=" <<
            Get(eI) << endl;
    }
    return (ss.str());
}